

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O1

Vec_Ptr_t * Nwk_ManRetimeCutForward(Nwk_Man_t *pMan,int nLatches,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  timespec ts;
  timespec local_40;
  
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pMan->nLatches = nLatches;
  pMan->nTruePis = pMan->nObjs[1] - nLatches;
  pMan->nTruePos = pMan->nObjs[2] - nLatches;
  pVVar9 = pMan->vCos;
  if (0 < pVVar9->nSize) {
    lVar8 = 0;
    do {
      puVar1 = (uint *)((long)pVVar9->pArray[lVar8] + 0x20);
      *puVar1 = *puVar1 | 0x10;
      lVar8 = lVar8 + 1;
      pVVar9 = pMan->vCos;
    } while (lVar8 < pVVar9->nSize);
  }
  if (0 < pMan->nTruePis) {
    lVar8 = 0;
    do {
      if (pMan->vCis->nSize <= lVar8) goto LAB_008de08b;
      Nwk_ManMarkTfoCone_rec((Nwk_Obj_t *)pMan->vCis->pArray[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < pMan->nTruePis);
  }
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  if (pMan->nLatches < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    iVar14 = 0;
    do {
      uVar5 = pMan->nTruePis + iVar14;
      if (((int)uVar5 < 0) || (pMan->vCis->nSize <= (int)uVar5)) goto LAB_008de08b;
      iVar6 = Nwk_ManPushForwardFast_rec((Nwk_Obj_t *)pMan->vCis->pArray[uVar5],(Nwk_Obj_t *)0x0);
      if (iVar6 != 0) {
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        iVar4 = iVar4 + 1;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < pMan->nLatches);
  }
  if (fVerbose != 0) {
    printf("Forward:  Max-flow = %4d -> ");
  }
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  if (pMan->nLatches < 1) {
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    iVar6 = 0;
    do {
      uVar5 = pMan->nTruePis + iVar6;
      if (((int)uVar5 < 0) || (pMan->vCis->nSize <= (int)uVar5)) goto LAB_008de08b;
      iVar7 = Nwk_ManPushForwardBot_rec((Nwk_Obj_t *)pMan->vCis->pArray[uVar5],(Nwk_Obj_t *)0x0);
      if (iVar7 != 0) {
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        iVar14 = iVar14 + 1;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < pMan->nLatches);
  }
  if (fVerbose != 0) {
    printf("%4d.  ");
  }
  if (0 < iVar14) {
    Nwk_ManIncrementTravId(pMan);
    Nwk_ManIncrementTravId(pMan);
    Nwk_ManIncrementTravId(pMan);
    if (0 < pMan->nLatches) {
      iVar6 = 0;
      do {
        uVar5 = pMan->nTruePis + iVar6;
        if (((int)uVar5 < 0) || (pMan->vCis->nSize <= (int)uVar5)) {
LAB_008de08b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar7 = Nwk_ManPushForwardBot_rec((Nwk_Obj_t *)pMan->vCis->pArray[uVar5],(Nwk_Obj_t *)0x0);
        if (iVar7 != 0) {
          __assert_fail("!RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                        ,0x1e6,"Vec_Ptr_t *Nwk_ManRetimeCutForward(Nwk_Man_t *, int, int)");
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < pMan->nLatches);
    }
  }
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < (iVar4 + iVar14) - 1U) {
    iVar6 = iVar4 + iVar14;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar6 << 3);
  }
  uVar13 = 0;
  pVVar9->pArray = ppvVar10;
  pVVar11 = pMan->vObjs;
  if (0 < pVVar11->nSize) {
    lVar8 = 0;
    uVar13 = 0;
    do {
      plVar3 = (long *)pVVar11->pArray[lVar8];
      if ((plVar3 != (long *)0x0) && ((int)plVar3[5] == *(int *)(*plVar3 + 0x68) + -2)) {
        if ((*(uint *)(plVar3 + 4) & 0x20) == 0) {
          __assert_fail("Nwk_ObjHasFlow(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                        ,0x1f0,"Vec_Ptr_t *Nwk_ManRetimeCutForward(Nwk_Man_t *, int, int)");
        }
        if ((*(uint *)(plVar3 + 4) & 7) == 2) {
          __assert_fail("!Nwk_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                        ,0x1f1,"Vec_Ptr_t *Nwk_ManRetimeCutForward(Nwk_Man_t *, int, int)");
        }
        uVar5 = pVVar9->nSize;
        uVar2 = pVVar9->nCap;
        if (uVar5 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
            }
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar2 * 2;
            if (iVar4 <= (int)uVar2) goto LAB_008ddf93;
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = iVar4;
        }
LAB_008ddf93:
        pVVar9->nSize = uVar5 + 1;
        pVVar9->pArray[(int)uVar5] = plVar3;
        uVar13 = (ulong)((int)uVar13 + (uint)((*(uint *)(plVar3 + 4) & 7) == 1));
      }
      lVar8 = lVar8 + 1;
      pVVar11 = pMan->vObjs;
    } while (lVar8 < pVVar11->nSize);
  }
  Nwk_ManCleanMarks(pMan);
  if (fVerbose != 0) {
    iVar4 = 0xa75836;
    printf("Min-cut = %4d.  Unmoved = %4d. ",(ulong)(uint)pVVar9->nSize,uVar13);
    Abc_Print(iVar4,"%s =","Time");
    iVar14 = 3;
    iVar4 = clock_gettime(3,&local_40);
    if (iVar4 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar8 + lVar12) / 1000000.0);
  }
  return pVVar9;
}

Assistant:

Vec_Ptr_t * Nwk_ManRetimeCutForward( Nwk_Man_t * pMan, int nLatches, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i, RetValue, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    // set the sequential parameters
    pMan->nLatches = nLatches;
    pMan->nTruePis = Nwk_ManCiNum(pMan) - nLatches;
    pMan->nTruePos = Nwk_ManCoNum(pMan) - nLatches;
    // mark the COs and the TFO of PIs
    Nwk_ManForEachCo( pMan, pObj, i )
        pObj->MarkA = 1;
    Nwk_ManForEachPiSeq( pMan, pObj, i )
        Nwk_ManMarkTfoCone_rec( pObj );
    // start flow computation from each LO
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLoSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushForwardFast_rec( pObj, NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter++;
    }
    if ( fVerbose )
    printf( "Forward:  Max-flow = %4d -> ", Counter );
    // continue flow computation from each LO
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLoSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushForwardBot_rec( pObj, NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter2++;
    }
    if ( fVerbose )
    printf( "%4d.  ", Counter+Counter2 );
    // repeat flow computation from each LO
    if ( Counter2 > 0 )
    {
        Nwk_ManIncrementTravIdFlow( pMan );
        Nwk_ManForEachLoSeq( pMan, pObj, i )
        {
            RetValue = Nwk_ManPushForwardBot_rec( pObj, NULL );
            assert( !RetValue );
        }
    }
    // cut is a set of nodes whose bottom is visited but top is not visited
    vNodes = Vec_PtrAlloc( Counter+Counter2 );
    Counter = 0;
    Nwk_ManForEachObj( pMan, pObj, i )
    {
        if ( Nwk_ObjVisitedBotOnly(pObj) )
        {
            assert( Nwk_ObjHasFlow(pObj) );
            assert( !Nwk_ObjIsCo(pObj) );
            Vec_PtrPush( vNodes, pObj );
            Counter += Nwk_ObjIsCi(pObj);
        }
    }
    Nwk_ManCleanMarks( pMan );
//    assert( Nwk_ManRetimeVerifyCutForward(pMan, vNodes) );
    if ( fVerbose )
    {
    printf( "Min-cut = %4d.  Unmoved = %4d. ", Vec_PtrSize(vNodes), Counter );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vNodes;
}